

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O1

CURLcode my_sha256_init(my_sha256_ctx *ctx)

{
  int iVar1;
  EVP_MD_CTX *ctx_00;
  EVP_MD *type;
  CURLcode CVar2;
  
  ctx_00 = (EVP_MD_CTX *)EVP_MD_CTX_new();
  ctx->openssl_ctx = (EVP_MD_CTX *)ctx_00;
  if (ctx_00 == (EVP_MD_CTX *)0x0) {
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  else {
    type = EVP_sha256();
    CVar2 = CURLE_OK;
    iVar1 = EVP_DigestInit_ex(ctx_00,type,(ENGINE *)0x0);
    if (iVar1 == 0) {
      EVP_MD_CTX_free(ctx->openssl_ctx);
      CVar2 = CURLE_FAILED_INIT;
    }
  }
  return CVar2;
}

Assistant:

static CURLcode my_sha256_init(my_sha256_ctx *ctx)
{
  ctx->openssl_ctx = EVP_MD_CTX_create();
  if(!ctx->openssl_ctx)
    return CURLE_OUT_OF_MEMORY;

  if(!EVP_DigestInit_ex(ctx->openssl_ctx, EVP_sha256(), NULL)) {
    EVP_MD_CTX_destroy(ctx->openssl_ctx);
    return CURLE_FAILED_INIT;
  }
  return CURLE_OK;
}